

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.h
# Opt level: O2

void __thiscall chrono::utils::ChISO2631_1_Wk::~ChISO2631_1_Wk(ChISO2631_1_Wk *this)

{
  ChButterworth_Lowpass::~ChButterworth_Lowpass(&this->lp);
  ChButterworth_Highpass::~ChButterworth_Highpass(&this->hp);
  return;
}

Assistant:

class ChApi ChISO2631_1_Wk {
  public:
    ChISO2631_1_Wk();
    ChISO2631_1_Wk(double step);
    void Config(double step);
    void Reset();
    double Filter(double u);

  private:
    static const double f1;
    static const double f2;
    static const double f3;
    static const double f4;
    static const double f5;
    static const double f6;
    static const double Q4;
    static const double Q5;
    static const double Q6;

    ChButterworth_Highpass hp;
    ChButterworth_Lowpass lp;
    ChISO2631_1_AVTransition avt;
    ChISO2631_1_UpwardStep ups;
}